

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O2

bool __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::can_simplify
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this)

{
  op_interface<viennamath::rt_expression_interface<double>_> *poVar1;
  int iVar2;
  
  iVar2 = (*((this->lhs_)._M_ptr)->_vptr_rt_expression_interface[8])();
  if ((char)iVar2 != '\0') {
    iVar2 = (*((this->rhs_)._M_ptr)->_vptr_rt_expression_interface[8])();
    if ((char)iVar2 != '\0') {
      return true;
    }
  }
  poVar1 = (this->op_)._M_ptr;
  iVar2 = (*poVar1->_vptr_op_interface[0xb])(poVar1,(this->lhs_)._M_ptr,(this->rhs_)._M_ptr);
  return SUB41(iVar2,0);
}

Assistant:

bool can_simplify() const
      {
        if (lhs_->is_constant() && rhs_->is_constant())
        {
          //std::cout << "optimizable(): true in rt_binary_expr" << std::endl;
          return true;
        }
        return op_->can_simplify(lhs_.get(), rhs_.get());
      }